

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessSetupOutputPipeNative(int *p,int *des)

{
  int iVar1;
  int *des_local;
  int *p_local;
  
  kwsysProcessCleanupDescriptor(p);
  iVar1 = fcntl64(*des,2,1);
  if ((-1 < iVar1) && (iVar1 = fcntl64(des[1],2,1), -1 < iVar1)) {
    *p = des[1];
    return 1;
  }
  return 0;
}

Assistant:

static int kwsysProcessSetupOutputPipeNative(int* p, int des[2])
{
  /* Close the existing descriptor.  */
  kwsysProcessCleanupDescriptor(p);

  /* Set close-on-exec flag on the pipe's ends.  The proper end will
     be dup2-ed into the standard descriptor number after fork but
     before exec.  */
  if((fcntl(des[0], F_SETFD, FD_CLOEXEC) < 0) ||
     (fcntl(des[1], F_SETFD, FD_CLOEXEC) < 0))
    {
    return 0;
    }

  /* Assign the replacement descriptor.  */
  *p = des[1];
  return 1;
}